

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlFileFlush(void *context)

{
  int iVar1;
  xmlParserErrors xVar2;
  int *piVar3;
  
  if (context == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = fflush((FILE *)context);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      xVar2 = xmlIOErr(*piVar3);
      return xVar2;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
xmlFileFlush (void * context) {
    FILE *file = context;

    if (file == NULL)
        return(-1);

    if (fflush(file) != 0)
        return(xmlIOErr(errno));

    return(XML_ERR_OK);
}